

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O0

MultiIndexSet *
TasGrid::MultiIndexManipulations::selectFlaggedChildren
          (MultiIndexSet *__return_storage_ptr__,MultiIndexSet *mset,
          vector<bool,_std::allocator<bool>_> *flagged,
          vector<int,_std::allocator<int>_> *level_limits)

{
  int iVar1;
  bool bVar2;
  const_reference cVar3;
  int iVar4;
  size_t new_stride;
  int *piVar5;
  int *piVar6;
  reference piVar7;
  reference piVar8;
  int *k_1;
  iterator __end5_1;
  iterator __begin5_1;
  vector<int,_std::allocator<int>_> *__range5_1;
  const_iterator ill;
  int i_1;
  int *k;
  iterator __end5;
  iterator __begin5;
  vector<int,_std::allocator<int>_> *__range5;
  int i;
  allocator<int> local_79;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> kid;
  Data2D<int> children_unsorted;
  int n;
  size_t num_dimensions;
  vector<int,_std::allocator<int>_> *level_limits_local;
  vector<bool,_std::allocator<bool>_> *flagged_local;
  MultiIndexSet *mset_local;
  
  new_stride = MultiIndexSet::getNumDimensions(mset);
  iVar4 = MultiIndexSet::getNumIndexes(mset);
  Data2D<int>::Data2D<unsigned_long,int>
            ((Data2D<int> *)
             &kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,new_stride,0);
  ::std::allocator<int>::allocator(&local_79);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_78,new_stride,&local_79);
  ::std::allocator<int>::~allocator(&local_79);
  bVar2 = ::std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)level_limits);
  if (bVar2) {
    for (__range5._0_4_ = 0; (int)__range5 < iVar4; __range5._0_4_ = (int)__range5 + 1) {
      cVar3 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)flagged,(long)(int)__range5);
      if (cVar3) {
        piVar5 = MultiIndexSet::getIndex(mset,(int)__range5);
        piVar6 = ::std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)local_78);
        ::std::copy_n<int_const*,unsigned_long,int*>(piVar5,new_stride,piVar6);
        __end5._M_current =
             (int *)::std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_78);
        k = (int *)::std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)local_78);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&k), bVar2) {
          piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end5);
          *piVar7 = *piVar7 + 1;
          bVar2 = MultiIndexSet::missing(mset,(vector<int,_std::allocator<int>_> *)local_78);
          if (bVar2) {
            Data2D<int>::appendStrip
                      ((Data2D<int> *)
                       &kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (vector<int,_std::allocator<int>_> *)local_78);
          }
          *piVar7 = *piVar7 + -1;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end5);
        }
      }
    }
  }
  else {
    for (ill._M_current._4_4_ = 0; ill._M_current._4_4_ < iVar4;
        ill._M_current._4_4_ = ill._M_current._4_4_ + 1) {
      cVar3 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)flagged,(long)ill._M_current._4_4_);
      if (cVar3) {
        piVar5 = MultiIndexSet::getIndex(mset,ill._M_current._4_4_);
        piVar6 = ::std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)local_78);
        ::std::copy_n<int_const*,unsigned_long,int*>(piVar5,new_stride,piVar6);
        __range5_1 = (vector<int,_std::allocator<int>_> *)
                     ::std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)level_limits);
        __end5_1._M_current =
             (int *)::std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_78);
        k_1 = (int *)::std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_78);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end5_1,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)&k_1), bVar2) {
          piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end5_1);
          *piVar7 = *piVar7 + 1;
          piVar8 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&__range5_1);
          if (((*piVar8 == -1) ||
              (iVar1 = *piVar7,
              piVar8 = __gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&__range5_1), iVar1 <= *piVar8)) &&
             (bVar2 = MultiIndexSet::missing(mset,(vector<int,_std::allocator<int>_> *)local_78),
             bVar2)) {
            Data2D<int>::appendStrip
                      ((Data2D<int> *)
                       &kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (vector<int,_std::allocator<int>_> *)local_78);
          }
          *piVar7 = *piVar7 + -1;
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &__range5_1,0);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end5_1);
        }
      }
    }
  }
  MultiIndexSet::MultiIndexSet
            (__return_storage_ptr__,
             (Data2D<int> *)
             &kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
  Data2D<int>::~Data2D
            ((Data2D<int> *)
             &kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet selectFlaggedChildren(const MultiIndexSet &mset, const std::vector<bool> &flagged, const std::vector<int> &level_limits){
    size_t num_dimensions = mset.getNumDimensions();
    int n = mset.getNumIndexes();

    Data2D<int> children_unsorted(num_dimensions, 0);

    #ifdef _OPENMP
    #pragma omp parallel
    {
        Data2D<int> lrefined(num_dimensions, 0);
        std::vector<int> kid(num_dimensions);

        if (level_limits.empty()){
            #pragma omp for
            for(int i=0; i<n; i++){
                if (flagged[i]){
                    std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                    for(auto &k : kid){
                        k++;
                        if (mset.missing(kid)) lrefined.appendStrip(kid);
                        k--;
                    }
                }
            }
        }else{
            #pragma omp for
            for(int i=0; i<n; i++){
                if (flagged[i]){
                    std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                    auto ill = level_limits.begin();
                    for(auto &k : kid){
                        k++;
                        if (((*ill == -1) || (k <= *ill)) && mset.missing(kid))
                            lrefined.appendStrip(kid);
                        k--;
                        ill++;
                    }
                }
            }
        }

        #pragma omp critical
        {
            children_unsorted.append(lrefined);
        }
    }
    #else
    std::vector<int> kid(num_dimensions);

    if (level_limits.empty()){
        for(int i=0; i<n; i++){
            if (flagged[i]){
                std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                for(auto &k : kid){
                    k++;
                    if (mset.missing(kid)) children_unsorted.appendStrip(kid);
                    k--;
                }
            }
        }
    }else{
        for(int i=0; i<n; i++){
            if (flagged[i]){
                std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                auto ill = level_limits.begin();
                for(auto &k : kid){
                    k++;
                    if (((*ill == -1) || (k <= *ill)) && mset.missing(kid))
                        children_unsorted.appendStrip(kid);
                    k--;
                    ill++;
                }
            }
        }
    }
    #endif

    return MultiIndexSet(children_unsorted);
}